

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# powerline.cc
# Opt level: O0

void powerline(ostringstream *oss,char *color,POWERLINE_DIRECTION direction,bool background_only)

{
  ostream *poVar1;
  char *pcVar2;
  byte in_CL;
  int in_EDX;
  char *in_RSI;
  ostream *in_RDI;
  string colorstr;
  char *in_stack_ffffffffffffff50;
  string local_70 [55];
  allocator local_39;
  string local_38 [35];
  byte local_15;
  char *local_10;
  ostream *local_8;
  
  local_15 = in_CL & 1;
  if (in_EDX == 0) {
    std::operator<<(in_RDI,in_RSI);
  }
  else {
    local_10 = in_RSI;
    if (in_EDX == 1) {
      if (local_15 == 0) {
        local_8 = in_RDI;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_38,in_RSI,&local_39);
        std::allocator<char>::~allocator((allocator<char> *)&local_39);
        poVar1 = std::operator<<(local_8,"#[");
        std::__cxx11::string::find((char *)local_38,0x106fb5);
        std::__cxx11::string::substr((ulong)local_70,(ulong)local_38);
        poVar1 = std::operator<<(poVar1,local_70);
        poVar1 = std::operator<<(poVar1,anon_var_dwarf_580d);
        std::operator<<(poVar1,local_10);
        std::__cxx11::string::~string(local_70);
        std::__cxx11::string::~string(local_38);
      }
      else {
        poVar1 = std::operator<<(in_RDI,' ');
        pcVar2 = bg2fg(in_stack_ffffffffffffff50);
        std::operator<<(poVar1,pcVar2);
      }
    }
    else if (in_EDX == 2) {
      poVar1 = std::operator<<(in_RDI,' ');
      pcVar2 = bg2fg(in_stack_ffffffffffffff50);
      poVar1 = std::operator<<(poVar1,pcVar2);
      poVar1 = std::operator<<(poVar1,anon_var_dwarf_5823);
      std::operator<<(poVar1,local_10);
    }
  }
  return;
}

Assistant:

void powerline( std::ostringstream & oss, const char color[],
  POWERLINE_DIRECTION direction, bool background_only )
{
  switch( direction )
    {
  case NONE:
    oss << color;
    break;
  case POWERLINE_LEFT:
    if( background_only )
      {
      oss << ' ' << bg2fg( color );
      }
    else
      {
      std::string colorstr( color );
      oss << "#[" << colorstr.substr( colorstr.find( "," ) + 1 )
          << PWL_LEFT_FILLED
          << color;
      }
    break;
  case POWERLINE_RIGHT:
    oss << ' '
        << bg2fg( color )
        << PWL_RIGHT_FILLED
        << color;
    break;
    };
}